

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

int s2pred::TriageCompareCosDistance<double>(Vector3<double> *x,Vector3<double> *y,double r2)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = x->c_[2] * y->c_[2] + x->c_[1] * y->c_[1] + x->c_[0] * y->c_[0] + 0.0;
  dVar2 = r2 * -0.5 + 1.0;
  dVar4 = dVar3 - dVar2;
  dVar2 = dVar2 * 2.220446049250313e-16 +
          ABS(dVar3) * 1.0547118733938987e-15 + 1.6653345369377348e-16;
  uVar1 = 0xffffffff;
  if (dVar4 <= dVar2) {
    uVar1 = (uint)(dVar4 < -dVar2);
  }
  return uVar1;
}

Assistant:

static T Dot(T sum, const T* a, const T* b, absl::index_sequence<Is...>) {
    Ignore({(sum += a[Is] * b[Is], true)...});
    return sum;
  }